

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  char cVar5;
  bool bVar6;
  xpath_value_type xVar7;
  size_t sVar8;
  char_t *to_00;
  size_t sVar9;
  char_t *pcVar10;
  char_t *pcVar11;
  char *str;
  double value;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  xpath_node xVar14;
  ulong local_5c8;
  ulong local_5c0;
  ulong local_560;
  xpath_node local_488;
  undefined1 local_478 [8];
  xpath_node_set_raw ns_3;
  xpath_stack swapped_stack_5;
  xpath_allocator_capture cr_8;
  char_t *end_4;
  char_t *begin_3;
  xpath_string s_7;
  char_t *end_3;
  char_t *begin_2;
  xpath_string to;
  xpath_string from;
  xpath_string s_6;
  xpath_stack swapped_stack_4;
  xpath_allocator_capture cr_7;
  char_t *end_2;
  char_t *begin_1;
  xpath_string s_5;
  char_t *end_1;
  char_t *begin;
  xpath_string s_4;
  char_t *rend_2;
  char_t *rbegin_2;
  size_t end;
  size_t pos_3;
  double last;
  double first_1;
  size_t s_length_1;
  xpath_string s_3;
  xpath_stack swapped_stack_3;
  xpath_allocator_capture cr_6;
  char_t *rend_1;
  char_t *rbegin_1;
  size_t pos_2;
  double first;
  size_t s_length;
  xpath_string s_2;
  xpath_stack swapped_stack_2;
  xpath_allocator_capture cr_5;
  char_t *rend;
  char_t *rbegin;
  char_t *pos_1;
  xpath_string p_1;
  xpath_string s_1;
  xpath_stack swapped_stack_1;
  xpath_allocator_capture cr_4;
  char_t *pos;
  xpath_string p;
  xpath_string s;
  xpath_stack swapped_stack;
  xpath_allocator_capture cr_3;
  xpath_node na_5;
  xpath_node_set_raw ns_2;
  xpath_allocator_capture cr_2;
  xpath_node na_4;
  xpath_node na_3;
  xpath_node_set_raw ns_1;
  xpath_allocator_capture cr_1;
  xpath_node na_2;
  xpath_node na_1;
  undefined1 local_70 [8];
  xpath_node_set_raw ns;
  xpath_allocator_capture cr;
  xpath_node na;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  auVar13 = in_ZMM1._0_16_;
  switch(this->_type) {
  case '\x12':
    xpath_string::from_const(__return_storage_ptr__,(this->_data).string);
    break;
  case '\x14':
    bVar4 = this->_rettype;
    xVar7 = xpath_variable::type((this->_data).variable);
    if (bVar4 != xVar7) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2a3b,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x03') {
      pcVar10 = xpath_variable::get_string((this->_data).variable);
      xpath_string::from_const(__return_storage_ptr__,pcVar10);
      return __return_storage_ptr__;
    }
  default:
    cVar5 = this->_rettype;
    if (cVar5 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&swapped_stack_5.temp,stack->temp);
      ns_3._eos = (xpath_node *)stack->temp;
      swapped_stack_5.result = stack->result;
      eval_node_set((xpath_node_set_raw *)local_478,this,c,(xpath_stack *)&ns_3._eos,
                    nodeset_eval_first);
      bVar6 = xpath_node_set_raw::empty((xpath_node_set_raw *)local_478);
      if (bVar6) {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
      else {
        local_488 = xpath_node_set_raw::first((xpath_node_set_raw *)local_478);
        string_value(__return_storage_ptr__,&local_488,stack->result);
      }
      xpath_allocator_capture::~xpath_allocator_capture
                ((xpath_allocator_capture *)&swapped_stack_5.temp);
    }
    else if (cVar5 == '\x02') {
      dVar12 = eval_number(this,c,stack);
      convert_number_to_string(__return_storage_ptr__,dVar12,stack->result);
    }
    else {
      if (cVar5 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2a57,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar6 = eval_boolean(this,c,stack);
      str = "false";
      if (bVar6) {
        str = "true";
      }
      xpath_string::from_const(__return_storage_ptr__,(char_t *)str);
    }
    break;
  case '\x19':
    cr._state._error = (bool *)(c->n)._node._root;
    pcVar10 = local_name((xpath_node *)&cr._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    break;
  case '\x1a':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)local_70,this->_left,c,stack,nodeset_eval_first);
    xVar14 = xpath_node_set_raw::first((xpath_node_set_raw *)local_70);
    na_2._attribute._attr = (xml_attribute_struct *)xVar14._node._root;
    pcVar10 = local_name((xpath_node *)&na_2._attribute);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns._eos);
    break;
  case '\x1b':
    cr_2._state._error = (bool *)(c->n)._node._root;
    na_4._node._root = (xml_node_struct *)(c->n)._attribute._attr;
    pcVar10 = namespace_uri((xpath_node *)&cr_2._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    break;
  case '\x1c':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns_2._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)&na_5._attribute,this->_left,c,stack,nodeset_eval_first);
    xVar14 = xpath_node_set_raw::first((xpath_node_set_raw *)&na_5._attribute);
    na_5._node._root = (xml_node_struct *)xVar14._attribute._attr;
    cr_3._state._error = (bool *)xVar14._node._root;
    pcVar10 = namespace_uri((xpath_node *)&cr_3._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns_2._eos);
    break;
  case '\x1d':
    cr_1._state._error = (bool *)(c->n)._node._root;
    na_2._node._root = (xml_node_struct *)(c->n)._attribute._attr;
    pcVar10 = qualified_name((xpath_node *)&cr_1._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    break;
  case '\x1e':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns_1._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)&na_3._attribute,this->_left,c,stack,nodeset_eval_first);
    xVar14 = xpath_node_set_raw::first((xpath_node_set_raw *)&na_3._attribute);
    na_3._node._root = (xml_node_struct *)xVar14._attribute._attr;
    na_4._attribute._attr = (xml_attribute_struct *)xVar14._node._root;
    pcVar10 = qualified_name((xpath_node *)&na_4._attribute);
    xpath_string::from_const(__return_storage_ptr__,pcVar10);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns_1._eos);
    break;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    break;
  case ' ':
    eval_string(__return_storage_ptr__,this->_left,c,stack);
    break;
  case '!':
    eval_string_concat(__return_storage_ptr__,this,c,stack);
    break;
  case '$':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp,stack->temp);
    s._length_heap = (size_t)stack->temp;
    swapped_stack.result = stack->result;
    eval_string((xpath_string *)&p._length_heap,this->_left,c,(xpath_stack *)&s._length_heap);
    eval_string((xpath_string *)&pos,this->_right,c,(xpath_stack *)&s._length_heap);
    pcVar10 = xpath_string::c_str((xpath_string *)&p._length_heap);
    pcVar11 = xpath_string::c_str((xpath_string *)&pos);
    pcVar10 = find_substring(pcVar10,pcVar11);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar11 = xpath_string::c_str((xpath_string *)&p._length_heap);
      xpath_string::from_heap(__return_storage_ptr__,pcVar11,pcVar10,stack->result);
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp);
    break;
  case '%':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_1.temp,stack->temp);
    s_1._length_heap = (size_t)stack->temp;
    swapped_stack_1.result = stack->result;
    eval_string((xpath_string *)&p_1._length_heap,this->_left,c,(xpath_stack *)&s_1._length_heap);
    eval_string((xpath_string *)&pos_1,this->_right,c,(xpath_stack *)&s_1._length_heap);
    pcVar10 = xpath_string::c_str((xpath_string *)&p_1._length_heap);
    pcVar11 = xpath_string::c_str((xpath_string *)&pos_1);
    pcVar10 = find_substring(pcVar10,pcVar11);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      sVar9 = xpath_string::length((xpath_string *)&pos_1);
      pcVar11 = xpath_string::c_str((xpath_string *)&p_1._length_heap);
      sVar8 = xpath_string::length((xpath_string *)&p_1._length_heap);
      bVar6 = xpath_string::uses_heap((xpath_string *)&p_1._length_heap);
      if (bVar6) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar10 + sVar9,pcVar11 + sVar8,stack->result);
      }
      else {
        xpath_string::from_const(__return_storage_ptr__,pcVar10 + sVar9);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_1.temp);
    break;
  case '&':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_2.temp,stack->temp);
    s_2._length_heap = (size_t)stack->temp;
    swapped_stack_2.result = stack->result;
    eval_string((xpath_string *)&s_length,this->_left,c,(xpath_stack *)&s_2._length_heap);
    sVar9 = xpath_string::length((xpath_string *)&s_length);
    dVar12 = eval_number(this->_right,c,stack);
    dVar12 = round_nearest(dVar12);
    bVar6 = is_nan(dVar12);
    if (bVar6) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      auVar13 = vcvtusi2sd_avx512f(auVar13,sVar9 + 1);
      if (dVar12 < auVar13._0_8_) {
        if (1.0 <= dVar12) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = dVar12;
          local_560 = vcvttsd2usi_avx512f(auVar1);
        }
        else {
          local_560 = 1;
        }
        if (local_560 == 0 || sVar9 + 1 < local_560) {
          __assert_fail("1 <= pos && pos <= s_length + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x29e0,
                        "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                       );
        }
        pcVar10 = xpath_string::c_str((xpath_string *)&s_length);
        pcVar11 = xpath_string::c_str((xpath_string *)&s_length);
        sVar9 = xpath_string::length((xpath_string *)&s_length);
        bVar6 = xpath_string::uses_heap((xpath_string *)&s_length);
        if (bVar6) {
          xpath_string::from_heap
                    (__return_storage_ptr__,pcVar10 + (local_560 - 1),pcVar11 + sVar9,stack->result)
          ;
        }
        else {
          xpath_string::from_const(__return_storage_ptr__,pcVar10 + (local_560 - 1));
        }
      }
      else {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_2.temp);
    break;
  case '\'':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_3.temp,stack->temp);
    s_3._length_heap = (size_t)stack->temp;
    swapped_stack_3.result = stack->result;
    eval_string((xpath_string *)&s_length_1,this->_left,c,(xpath_stack *)&s_3._length_heap);
    sVar9 = xpath_string::length((xpath_string *)&s_length_1);
    dVar12 = eval_number(this->_right,c,stack);
    value = round_nearest(dVar12);
    dVar12 = eval_number(this->_right->_next,c,stack);
    dVar12 = round_nearest(dVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    dVar12 = value + dVar12;
    bVar6 = is_nan(value);
    if ((bVar6) || (bVar6 = is_nan(dVar12), bVar6)) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      auVar13 = vcvtusi2sd_avx512f(auVar13,sVar9 + 1);
      if (value < auVar13._0_8_) {
        if (value < dVar12) {
          if (1.0 <= dVar12) {
            if (1.0 <= value) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = value;
              local_5c0 = vcvttsd2usi_avx512f(auVar2);
            }
            else {
              local_5c0 = 1;
            }
            auVar13 = vcvtusi2sd_avx512f(auVar13,sVar9 + 1);
            if (dVar12 < auVar13._0_8_) {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = dVar12;
              local_5c8 = vcvttsd2usi_avx512f(auVar3);
            }
            else {
              local_5c8 = sVar9 + 1;
            }
            bVar6 = false;
            if ((local_5c0 != 0) && (bVar6 = false, local_5c0 <= local_5c8)) {
              bVar6 = local_5c8 <= sVar9 + 1;
            }
            if (!bVar6) {
              __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                            ,0x29fc,
                            "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                           );
            }
            pcVar10 = xpath_string::c_str((xpath_string *)&s_length_1);
            pcVar11 = xpath_string::c_str((xpath_string *)&s_length_1);
            s_4._length_heap = (size_t)(pcVar11 + (local_5c8 - 1));
            if ((local_5c8 != sVar9 + 1) ||
               (bVar6 = xpath_string::uses_heap((xpath_string *)&s_length_1), bVar6)) {
              xpath_string::from_heap
                        (__return_storage_ptr__,pcVar10 + (local_5c0 - 1),(char_t *)s_4._length_heap
                         ,stack->result);
            }
            else {
              xpath_string::from_const(__return_storage_ptr__,pcVar10 + (local_5c0 - 1));
            }
          }
          else {
            xpath_string::xpath_string(__return_storage_ptr__);
          }
        }
        else {
          xpath_string::xpath_string(__return_storage_ptr__);
        }
      }
      else {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_3.temp);
    break;
  case '*':
    string_value((xpath_string *)&begin,&c->n,stack->result);
    pcVar10 = xpath_string::data((xpath_string *)&begin,stack->result);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      s_5._length_heap = (size_t)normalize_space(pcVar10);
      xpath_string::from_heap_preallocated
                (__return_storage_ptr__,pcVar10,(char_t *)s_5._length_heap);
    }
    break;
  case '+':
    eval_string((xpath_string *)&begin_1,this->_left,c,stack);
    pcVar10 = xpath_string::data((xpath_string *)&begin_1,stack->result);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar11 = normalize_space(pcVar10);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar10,pcVar11);
    }
    break;
  case ',':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_4.temp,stack->temp);
    s_6._length_heap = (size_t)stack->temp;
    swapped_stack_4.result = stack->result;
    eval_string((xpath_string *)&from._length_heap,this->_left,c,stack);
    eval_string((xpath_string *)&to._length_heap,this->_right,c,(xpath_stack *)&s_6._length_heap);
    eval_string((xpath_string *)&begin_2,this->_right->_next,c,(xpath_stack *)&s_6._length_heap);
    pcVar10 = xpath_string::data((xpath_string *)&from._length_heap,stack->result);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar11 = xpath_string::c_str((xpath_string *)&to._length_heap);
      to_00 = xpath_string::c_str((xpath_string *)&begin_2);
      sVar9 = xpath_string::length((xpath_string *)&begin_2);
      s_7._length_heap = (size_t)translate(pcVar10,pcVar11,to_00,sVar9);
      xpath_string::from_heap_preallocated
                (__return_storage_ptr__,pcVar10,(char_t *)s_7._length_heap);
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_4.temp);
    break;
  case ':':
    eval_string((xpath_string *)&begin_3,this->_left,c,stack);
    pcVar10 = xpath_string::data((xpath_string *)&begin_3,stack->result);
    if (pcVar10 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar11 = translate_table(pcVar10,(this->_data).table);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar10,pcVar11);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= s_length + 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= s_length + 1) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= s_length + 1 ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

				case xpath_type_number:
					return convert_number_to_string(eval_number(c, stack), stack.result);

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.temp);

					xpath_stack swapped_stack = {stack.temp, stack.result};

					xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
					return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
				}

				default:
					assert(false && "Wrong expression for return type string"); // unreachable
					return xpath_string();
				}
			}
			}
		}